

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreenode(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  ushort uVar1;
  uint uVar2;
  u8 uVar3;
  uint uVar4;
  i64 iVar5;
  RtreeNode *pNode;
  sqlite3_str *p;
  char *z;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  long in_FS_OFFSET;
  RtreeCell cell;
  RtreeCell local_430;
  Rtree local_400;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_400,0,0x3c8);
  iVar5 = sqlite3VdbeIntValue(*apArg);
  local_400.nDim = (u8)iVar5;
  if (0xfffffffa < ((uint)iVar5 & 0xff) - 6) {
    uVar3 = local_400.nDim * '\x02';
    bVar8 = local_400.nDim * '\b' + 8;
    local_400.nDim2 = uVar3;
    local_400.nBytesPerCell = bVar8;
    pNode = (RtreeNode *)sqlite3_value_blob(apArg[1]);
    if (((pNode != (RtreeNode *)0x0) && (uVar4 = sqlite3ValueBytes(apArg[1],'\x01'), 3 < (int)uVar4)
        ) && (uVar1 = *(ushort *)((long)&pNode->pParent + 2),
             (uint)bVar8 * (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) <= uVar4)) {
      p = sqlite3_str_new((sqlite3 *)0x0);
      uVar1 = *(ushort *)((long)&pNode->pParent + 2);
      if ((uVar1 & 0xff) == 0 && uVar1 >> 8 == 0) {
        if (p != (sqlite3_str *)0x0) goto LAB_001f50f2;
        uVar4 = 7;
      }
      else {
        uVar4 = 0;
        do {
          local_430.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
          local_430.aCoord[4].i = -1;
          local_430.aCoord[5].i = -1;
          local_430.aCoord[6].i = -1;
          local_430.aCoord[7].i = -1;
          local_430.aCoord[0].i = -1;
          local_430.aCoord[1].i = -1;
          local_430.aCoord[2].i = -1;
          local_430.aCoord[3].i = -1;
          local_430.aCoord[8] = (RtreeCoord)0xffffffff;
          local_430.aCoord[9] = (RtreeCoord)0xffffffff;
          nodeGetCell(&local_400,pNode,uVar4,&local_430);
          if (uVar4 != 0) {
            uVar2 = p->nChar;
            uVar6 = uVar2 + 1;
            if (uVar6 < p->nAlloc) {
              p->nChar = uVar6;
              p->zText[uVar2] = ' ';
            }
            else {
              enlargeAndAppend(p," ",1);
            }
          }
          sqlite3_str_appendf(p,"{%lld",local_430.iRowid);
          if (uVar3 != '\0') {
            uVar7 = 0;
            do {
              sqlite3_str_appendf(p," %g",SUB84((double)*(float *)((long)local_430.aCoord + uVar7),0
                                               ));
              uVar7 = uVar7 + 4;
            } while (((uint)iVar5 & 0x7f) << 3 != uVar7);
          }
          uVar2 = p->nChar;
          uVar6 = uVar2 + 1;
          if (uVar6 < p->nAlloc) {
            p->nChar = uVar6;
            p->zText[uVar2] = '}';
          }
          else {
            enlargeAndAppend(p,"}",1);
          }
          uVar4 = uVar4 + 1;
          uVar1 = *(ushort *)((long)&pNode->pParent + 2);
        } while (uVar4 < (ushort)(uVar1 << 8 | uVar1 >> 8));
LAB_001f50f2:
        uVar4 = (uint)p->accError;
      }
      sqlite3_result_error_code(ctx,uVar4);
      z = sqlite3_str_finish(p);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        setResultStrOrError(ctx,z,-1,'\x01',sqlite3_free);
        return;
      }
      goto LAB_001f5154;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001f5154:
  __stack_chk_fail();
}

Assistant:

static void rtreenode(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  RtreeNode node;
  Rtree tree;
  int ii;
  int nData;
  int errCode;
  sqlite3_str *pOut;

  UNUSED_PARAMETER(nArg);
  memset(&node, 0, sizeof(RtreeNode));
  memset(&tree, 0, sizeof(Rtree));
  tree.nDim = (u8)sqlite3_value_int(apArg[0]);
  if( tree.nDim<1 || tree.nDim>5 ) return;
  tree.nDim2 = tree.nDim*2;
  tree.nBytesPerCell = 8 + 8 * tree.nDim;
  node.zData = (u8 *)sqlite3_value_blob(apArg[1]);
  if( node.zData==0 ) return;
  nData = sqlite3_value_bytes(apArg[1]);
  if( nData<4 ) return;
  if( nData<NCELL(&node)*tree.nBytesPerCell ) return;

  pOut = sqlite3_str_new(0);
  for(ii=0; ii<NCELL(&node); ii++){
    RtreeCell cell;
    int jj;

    nodeGetCell(&tree, &node, ii, &cell);
    if( ii>0 ) sqlite3_str_append(pOut, " ", 1);
    sqlite3_str_appendf(pOut, "{%lld", cell.iRowid);
    for(jj=0; jj<tree.nDim2; jj++){
#ifndef SQLITE_RTREE_INT_ONLY
      sqlite3_str_appendf(pOut, " %g", (double)cell.aCoord[jj].f);
#else
      sqlite3_str_appendf(pOut, " %d", cell.aCoord[jj].i);
#endif
    }
    sqlite3_str_append(pOut, "}", 1);
  }
  errCode = sqlite3_str_errcode(pOut);
  sqlite3_result_error_code(ctx, errCode);
  sqlite3_result_text(ctx, sqlite3_str_finish(pOut), -1, sqlite3_free);
}